

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

void __thiscall Func::SetHasImplicitCallsOnSelfAndParents(Func *this)

{
  bool bVar1;
  undefined1 local_21;
  undefined8 local_18;
  Func *curFunc;
  Func *this_local;
  
  SetHasImplicitCalls(this,true);
  local_18 = GetParentFunc(this);
  while( true ) {
    local_21 = 0;
    if (local_18 != (Func *)0x0) {
      bVar1 = IsTopFunc(local_18);
      local_21 = bVar1 ^ 0xff;
    }
    if ((local_21 & 1) == 0) break;
    SetHasImplicitCalls(local_18,true);
    local_18 = GetParentFunc(local_18);
  }
  return;
}

Assistant:

void                SetHasImplicitCallsOnSelfAndParents()
                        {
                            this->SetHasImplicitCalls(true);
                            Func *curFunc = this->GetParentFunc();
                            while (curFunc && !curFunc->IsTopFunc())
                            {
                                curFunc->SetHasImplicitCalls(true);
                                curFunc = curFunc->GetParentFunc();
                            }
                        }